

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void Abc_FlowRetime_ConstrainExactAll(Abc_Ntk_t *pNtk)

{
  void **__ptr;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar1 = pNtk->vObjs->nSize, iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar4);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      if (pManMR->vTimeEdges[(uint)pAVar2->Id].nSize != 0) {
        pVVar3 = pManMR->vTimeEdges + (uint)pAVar2->Id;
        __ptr = pVVar3->pArray;
        pVVar3->nCap = 0;
        pVVar3->nSize = 0;
        pVVar3->pArray = (void **)0x0;
        free(__ptr);
      }
    }
  }
  pManMR->nExactConstraints = 0;
  for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    pAVar2 = Abc_NtkObj(pNtk,iVar4);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) != 8)) {
      if (((undefined1  [24])
           ((undefined1  [24])pManMR->pDataArray[(uint)pAVar2->Id] & (undefined1  [24])0x90) ==
           (undefined1  [24])0x80) && (pManMR->vTimeEdges[(uint)pAVar2->Id].nSize == 0)) {
        Abc_FlowRetime_ConstrainExact(pAVar2);
      }
    }
    iVar1 = pNtk->vObjs->nSize;
  }
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExactAll( Abc_Ntk_t * pNtk ) {
  int i;
  Abc_Obj_t *pObj;
  void *pArray;
  
  // free existing constraints
  Abc_NtkForEachObj( pNtk, pObj, i )    
    if ( Vec_PtrSize( FTIMEEDGES(pObj) )) {
      pArray =  Vec_PtrReleaseArray( FTIMEEDGES(pObj) );
      ABC_FREE( pArray );
    }
  pManMR->nExactConstraints = 0;
  
  // generate all constraints
  Abc_NtkForEachObj(pNtk, pObj, i)
    if (!Abc_ObjIsLatch(pObj) && FTEST( pObj, CONSERVATIVE ) && !FTEST( pObj, BLOCK ))
      if (!Vec_PtrSize( FTIMEEDGES( pObj ) ))
        Abc_FlowRetime_ConstrainExact( pObj );
}